

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::GetTargetDirectDepends
          (cmComputeTargetDepends *this,cmGeneratorTarget *t,cmTargetDependSet *deps)

{
  int iVar1;
  pointer pcVar2;
  iterator iVar3;
  pointer pcVar4;
  pair<std::_Rb_tree_iterator<cmTargetDepend>,_bool> pVar5;
  cmTargetDepend local_40;
  cmGeneratorTarget *local_30;
  
  local_30 = t;
  iVar3 = std::
          _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_int>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_int>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
          ::find(&(this->TargetIndex)._M_t,&local_30);
  if ((_Rb_tree_header *)iVar3._M_node != &(this->TargetIndex)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = *(int *)&iVar3._M_node[1]._M_parent;
    pcVar2 = (this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pcVar4 = *(pointer *)
                   &pcVar2[iVar1].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                    super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
        pcVar4 != *(pointer *)
                   ((long)&pcVar2[iVar1].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                           super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
        pcVar4 = pcVar4 + 1) {
      local_40.Target =
           (this->Targets).
           super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           ._M_impl.super__Vector_impl_data._M_start[pcVar4->Dest];
      local_40.Link = false;
      local_40.Util = false;
      pVar5 = std::
              _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
              ::_M_insert_unique<cmTargetDepend>
                        ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                          *)deps,&local_40);
      if (pcVar4->Strong == true) {
        *(undefined1 *)((long)&pVar5.first._M_node._M_node[1]._M_parent + 1) = 1;
      }
      else {
        *(undefined1 *)&pVar5.first._M_node._M_node[1]._M_parent = 1;
      }
    }
    return;
  }
  __assert_fail("tii != this->TargetIndex.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmComputeTargetDepends.cxx"
                ,0x92,
                "void cmComputeTargetDepends::GetTargetDirectDepends(const cmGeneratorTarget *, cmTargetDependSet &)"
               );
}

Assistant:

void cmComputeTargetDepends::GetTargetDirectDepends(cmGeneratorTarget const* t,
                                                    cmTargetDependSet& deps)
{
  // Lookup the index for this target.  All targets should be known by
  // this point.
  std::map<cmGeneratorTarget const*, int>::const_iterator tii =
    this->TargetIndex.find(t);
  assert(tii != this->TargetIndex.end());
  int i = tii->second;

  // Get its final dependencies.
  EdgeList const& nl = this->FinalGraph[i];
  for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
    cmGeneratorTarget const* dep = this->Targets[*ni];
    cmTargetDependSet::iterator di = deps.insert(dep).first;
    di->SetType(ni->IsStrong());
  }
}